

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

FILE * fopen_compchk(char *file,int32 *ispipe)

{
  undefined8 in_RAX;
  FILE *pFVar1;
  size_t sVar2;
  char *__dest;
  long lVar3;
  char *pcVar4;
  int32 isgz;
  int32 local_34;
  
  local_34 = (int32)((ulong)in_RAX >> 0x20);
  pFVar1 = fopen_comp(file,"r",ispipe);
  if (pFVar1 != (FILE *)0x0) {
    return pFVar1;
  }
  guess_comptype(file,ispipe,&local_34);
  sVar2 = strlen(file);
  __dest = (char *)__ckd_calloc__(sVar2 + 5,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                  ,0xde);
  strcpy(__dest,file);
  switch(local_34) {
  case 0:
    builtin_strncpy(__dest + sVar2,".gz",4);
    pFVar1 = fopen_comp(__dest,"r",ispipe);
    if (pFVar1 == (FILE *)0x0) {
      pcVar4 = __dest + sVar2;
      builtin_strncpy(__dest + sVar2,".bz2",5);
      pFVar1 = fopen_comp(__dest,"r",ispipe);
      if (pFVar1 == (FILE *)0x0) {
        pcVar4[2] = '\0';
        pcVar4[0] = '.';
        pcVar4[1] = 'Z';
        pFVar1 = fopen_comp(__dest,"r",ispipe);
        if (pFVar1 == (FILE *)0x0) {
          pFVar1 = (FILE *)0x0;
          goto LAB_0010cb64;
        }
        lVar3 = 0xf9;
      }
      else {
        lVar3 = 0xf3;
      }
    }
    else {
      lVar3 = 0xed;
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
            ,lVar3,"Using %s instead of %s\n",__dest,file);
    goto LAB_0010cb64;
  case 1:
    lVar3 = -2;
    break;
  case 2:
    lVar3 = -3;
    break;
  case 3:
    lVar3 = -4;
    break;
  default:
    goto switchD_0010cac7_default;
  }
  __dest[lVar3 + sVar2] = '\0';
switchD_0010cac7_default:
  pFVar1 = (FILE *)0x0;
  err_msg(ERR_WARN,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
          ,0x100,"Using %s instead of %s\n",__dest,file);
  fopen_comp(__dest,"r",ispipe);
LAB_0010cb64:
  ckd_free(__dest);
  return pFVar1;
}

Assistant:

FILE *
fopen_compchk(const char *file, int32 * ispipe)
{
#ifndef HAVE_POPEN
    *ispipe = 0; /* No popen() on WinCE */
    /* And therefore the rest of this function is useless. */
    return (fopen_comp(file, "r", ispipe));
#else /* HAVE_POPEN */
    int32 isgz;
    FILE *fh;

    /* First just try to fopen_comp() it */
    if ((fh = fopen_comp(file, "r", ispipe)) != NULL)
        return fh;
    else {
        char *tmpfile;
        size_t k;

        /* File doesn't exist; try other compressed/uncompressed form, as appropriate */
        guess_comptype(file, ispipe, &isgz);
        k = strlen(file);
        tmpfile = ckd_calloc(k+5, 1);
        strcpy(tmpfile, file);
        switch (isgz) {
        case COMP_GZIP:
            tmpfile[k - 3] = '\0';
            break;
        case COMP_BZIP2:
            tmpfile[k - 4] = '\0';
            break;
        case COMP_COMPRESS:
            tmpfile[k - 2] = '\0';
            break;
        case COMP_NONE:
            strcpy(tmpfile + k, ".gz");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            strcpy(tmpfile + k, ".bz2");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            strcpy(tmpfile + k, ".Z");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            ckd_free(tmpfile);
            return NULL;
        }
        E_WARN("Using %s instead of %s\n", tmpfile, file);
        fh = fopen_comp(tmpfile, "r", ispipe);
        ckd_free(tmpfile);
        return NULL;
    }
#endif /* HAVE_POPEN */
}